

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
IntegerInstance::op_isLessThanOrEqualTo
          (IntegerInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  size_type sVar2;
  undefined8 *puVar3;
  char *pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  string *in_RDI;
  enable_shared_from_this<Instance> *in_stack_ffffffffffffff08;
  shared_ptr<Instance> *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  allocator *paVar5;
  InstanceIsLessThanOrEqualToComparator *in_stack_ffffffffffffff20;
  InstanceIsLessThanOrEqualToComparator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff68;
  InstanceIsLessThanOrEqualToComparator local_80 [35];
  allocator local_5d [69];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar2 != 1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  bVar1 = Grammar::is_integer_value(in_stack_ffffffffffffff18);
  if (!bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,0);
    bVar1 = Grammar::is_float_value(in_stack_ffffffffffffff68);
    if (!bVar1) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "RuntimeError: invalid argument.";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  bVar1 = Grammar::is_integer_value(in_stack_ffffffffffffff18);
  if (bVar1) {
    std::enable_shared_from_this<Instance>::shared_from_this(in_stack_ffffffffffffff08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,0);
    std::make_shared<IntegerInstance,std::__cxx11::string_const&>(in_stack_ffffffffffffff38);
    std::shared_ptr<Instance>::shared_ptr<IntegerInstance,void>
              (in_stack_ffffffffffffff10,(shared_ptr<IntegerInstance> *)in_stack_ffffffffffffff08);
    bVar1 = InstanceIsLessThanOrEqualToComparator::operator()
                      (in_stack_ffffffffffffff20,(shared_ptr<Instance> *)in_stack_ffffffffffffff18,
                       in_stack_ffffffffffffff10);
    pcVar4 = "false";
    if (bVar1) {
      pcVar4 = "true";
    }
    paVar5 = local_5d;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,pcVar4,paVar5);
    std::allocator<char>::~allocator((allocator<char> *)local_5d);
    std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1b7879);
    std::shared_ptr<IntegerInstance>::~shared_ptr((shared_ptr<IntegerInstance> *)0x1b7886);
    std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1b7893);
  }
  else {
    std::enable_shared_from_this<Instance>::shared_from_this(in_stack_ffffffffffffff08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,0);
    std::make_shared<FloatInstance,std::__cxx11::string_const&>(in_stack_ffffffffffffff38);
    this_00 = local_80;
    std::shared_ptr<Instance>::shared_ptr<FloatInstance,void>
              (in_stack_ffffffffffffff10,(shared_ptr<FloatInstance> *)in_stack_ffffffffffffff08);
    bVar1 = InstanceIsLessThanOrEqualToComparator::operator()
                      (this_00,(shared_ptr<Instance> *)in_stack_ffffffffffffff18,
                       in_stack_ffffffffffffff10);
    pcVar4 = "false";
    if (bVar1) {
      pcVar4 = "true";
    }
    paVar5 = (allocator *)&stack0xffffffffffffff6f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,pcVar4,paVar5);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
    std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1b79d2);
    std::shared_ptr<FloatInstance>::~shared_ptr((shared_ptr<FloatInstance> *)0x1b79dc);
    std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1b79e9);
  }
  return in_RDI;
}

Assistant:

std::string IntegerInstance::op_isLessThanOrEqualTo(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    if (!Grammar::is_integer_value(arguments[0]) && !Grammar::is_float_value(arguments[0]))
        throw EXC_INVALID_ARGUMENT;
    if (Grammar::is_integer_value(arguments[0]))
        return InstanceIsLessThanOrEqualToComparator()(shared_from_this(),
                                                       std::make_shared<IntegerInstance>(arguments[0])) ?
               "true" : "false";
    return InstanceIsLessThanOrEqualToComparator()(shared_from_this(), std::make_shared<FloatInstance>(arguments[0])) ?
           "true" : "false";
}